

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTableIterator::Seek(MemTableIterator *this,Slice *k)

{
  char *local_20;
  Slice *local_18;
  Slice *k_local;
  MemTableIterator *this_local;
  
  local_18 = k;
  k_local = (Slice *)this;
  local_20 = EncodeKey(&this->tmp_,k);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek(&this->iter_,&local_20);
  return;
}

Assistant:

void Seek(const Slice& k) override { iter_.Seek(EncodeKey(&tmp_, k)); }